

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImDrawVert *pIVar5;
  ImVec4 *pIVar6;
  int iVar7;
  ImVec2 IVar8;
  int iVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  ImDrawIdx IVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ImDrawIdx *pIVar17;
  byte bVar18;
  ImDrawIdx IVar19;
  undefined7 in_register_00000081;
  ImDrawIdx IVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  ulong uVar23;
  ImDrawIdx IVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float afStack_b8 [2];
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  ImVec2 IStack_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ulong local_88;
  ulong local_80;
  float local_78;
  ulong local_60;
  int local_54;
  undefined4 local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  uint local_38;
  byte local_31;
  
  if (points_count < 2) {
    return;
  }
  local_88 = (ulong)(uint)points_count;
  IVar4 = this->_Data->TexUvWhitePixel;
  local_80 = (ulong)(points_count - 1U);
  uVar14 = points_count - 1U;
  if (closed) {
    uVar14 = points_count;
  }
  local_40 = (ulong)(uint)points_count;
  local_98.x = thickness;
  if ((this->Flags & 1U) == 0) {
    uStack_b0 = 0x130895;
    PrimReserve(this,uVar14 * 6,uVar14 << 2);
    for (uVar10 = 1; uVar10 - uVar14 != 1; uVar10 = uVar10 + 1) {
      uVar15 = uVar10 & 0xffffffff;
      if (local_40 == uVar10) {
        uVar15 = 0;
      }
      fVar27 = points[uVar10 - 1].x;
      fVar25 = points[uVar10 - 1].y;
      fVar29 = points[uVar15].x - fVar27;
      fVar31 = points[uVar15].y - fVar25;
      fVar30 = fVar29 * fVar29 + fVar31 * fVar31;
      if (0.0 < fVar30) {
        fVar30 = 1.0 / SQRT(fVar30);
        fVar31 = fVar31 * fVar30;
        fVar29 = fVar29 * fVar30;
      }
      fVar31 = fVar31 * local_98.x * 0.5;
      fVar29 = fVar29 * local_98.x * 0.5;
      pIVar5 = this->_VtxWritePtr;
      IVar8.y = fVar25 - fVar29;
      IVar8.x = fVar27 + fVar31;
      pIVar5->pos = IVar8;
      pIVar5->uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos.x = points[uVar15].x + fVar31;
      pIVar5[1].pos.y = points[uVar15].y - fVar29;
      pIVar5[1].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = col;
      pIVar5[2].pos.x = points[uVar15].x - fVar31;
      pIVar5[2].pos.y = points[uVar15].y + fVar29;
      pIVar5[2].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[2].col = col;
      pIVar5[3].pos.x = points[uVar10 - 1].x - fVar31;
      pIVar5[3].pos.y = points[uVar10 - 1].y + fVar29;
      pIVar5[3].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[3].col = col;
      this->_VtxWritePtr = pIVar5 + 4;
      uVar22 = this->_VtxCurrentIdx;
      pIVar17 = this->_IdxWritePtr;
      IVar13 = (ImDrawIdx)uVar22;
      *pIVar17 = IVar13;
      pIVar17[1] = IVar13 + 1;
      pIVar17[2] = IVar13 + 2;
      pIVar17[3] = IVar13;
      pIVar17[4] = IVar13 + 2;
      pIVar17[5] = IVar13 + 3;
      this->_IdxWritePtr = pIVar17 + 6;
      this->_VtxCurrentIdx = uVar22 + 4;
    }
    return;
  }
  local_78 = thickness;
  if (thickness <= 1.0) {
    local_78 = 1.0;
  }
  local_4c = (int)local_78;
  fVar31 = this->_FringeScale;
  local_31 = fVar31 == 1.0 & local_4c < 0x3f & (byte)this->Flags >> 1 &
             local_78 - (float)local_4c <= 1e-05;
  iVar7 = 0x12;
  if (thickness <= fVar31) {
    iVar7 = 0xc;
  }
  iVar9 = 6;
  if (local_31 == 0) {
    iVar9 = iVar7;
  }
  _local_a8 = ZEXT416((uint)fVar31);
  local_50 = (undefined4)CONCAT71(in_register_00000081,closed);
  if (local_31 == 1) {
    local_54 = points_count * 2;
    local_60 = 3;
  }
  else {
    local_54 = points_count * 3;
    if (fVar31 < thickness) {
      local_54 = points_count * 4;
    }
    local_60 = (ulong)((uint)(fVar31 < thickness) * 2 + 3);
  }
  local_38 = col & 0xffffff;
  uStack_b0 = 0x130ae2;
  local_48 = (ulong)uVar14;
  PrimReserve(this,iVar9 * uVar14,local_54);
  uVar15 = local_40;
  lVar12 = -((ulong)(uint)((int)local_60 * (int)local_88) * 8 + 0xf & 0xfffffffffffffff0);
  puVar11 = (undefined8 *)(local_a8 + lVar12);
  uVar23 = -local_48;
  for (uVar10 = 1; uVar23 + uVar10 != 1; uVar10 = uVar10 + 1) {
    uVar16 = uVar10 & 0xffffffff;
    if (uVar15 == uVar10) {
      uVar16 = 0;
    }
    fVar31 = points[uVar16].x - points[uVar10 - 1].x;
    fVar29 = points[uVar16].y - points[uVar10 - 1].y;
    fVar27 = fVar31 * fVar31 + fVar29 * fVar29;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar31 = fVar31 * fVar27;
      fVar29 = fVar29 * fVar27;
    }
    *(float *)(local_a8 + uVar10 * 8 + lVar12 + -8) = fVar29;
    *(float *)(local_a8 + uVar10 * 8 + lVar12 + -4) = -fVar31;
  }
  pfVar1 = (float *)(puVar11 + uVar15);
  local_48 = uVar23;
  fVar31 = (float)local_a8._0_4_;
  if ((char)local_50 == '\0') {
    uVar10 = local_80 & 0xffffffff;
    puVar11[uVar10] = *(undefined8 *)(pfVar1 + -4);
    bVar18 = local_31;
    fVar29 = points[uVar10].x;
    fVar27 = points[uVar10].y;
    if ((float)local_a8._0_4_ < local_98.x && local_31 == 0) {
      fVar31 = (local_78 - (float)local_a8._0_4_) * 0.5;
      fVar34 = (float)local_a8._0_4_ + fVar31;
      fVar25 = (float)*puVar11;
      fVar30 = (float)((ulong)*puVar11 >> 0x20);
      fVar26 = fVar25 * fVar34;
      fVar32 = fVar30 * fVar34;
      fVar28 = (*points).x;
      fVar33 = (*points).y;
      fVar25 = fVar25 * fVar31;
      fVar30 = fVar30 * fVar31;
      *pfVar1 = fVar26 + fVar28;
      pfVar1[1] = fVar32 + fVar33;
      pfVar1[2] = fVar25 + fVar28;
      pfVar1[3] = fVar30 + fVar33;
      pfVar1[4] = fVar28 - fVar25;
      pfVar1[5] = fVar33 - fVar30;
      pfVar1[6] = fVar28 - fVar26;
      pfVar1[7] = fVar33 - fVar32;
      uVar16 = (ulong)(uint)((int)local_80 << 2);
      *(ulong *)(pfVar1 + uVar16 * 2) =
           CONCAT44((float)((ulong)puVar11[uVar10] >> 0x20) * fVar34 + fVar27,
                    (float)puVar11[uVar10] * fVar34 + fVar29);
      *(ulong *)(pfVar1 + uVar16 * 2 + 2) =
           CONCAT44((float)((ulong)puVar11[uVar10] >> 0x20) * fVar31 + fVar27,
                    (float)puVar11[uVar10] * fVar31 + fVar29);
      *(ulong *)(pfVar1 + uVar16 * 2 + 4) =
           CONCAT44(fVar27 - (float)((ulong)puVar11[uVar10] >> 0x20) * fVar31,
                    fVar29 - (float)puVar11[uVar10] * fVar31);
      *(ulong *)(pfVar1 + uVar16 * 2 + 6) =
           CONCAT44(fVar27 - (float)((ulong)puVar11[uVar10] >> 0x20) * fVar34,
                    fVar29 - (float)puVar11[uVar10] * fVar34);
      goto LAB_00130ef0;
    }
    if (local_31 != 0) {
      fVar31 = local_78 * 0.5 + 1.0;
    }
    fVar25 = (float)*puVar11 * fVar31;
    fVar30 = (float)((ulong)*puVar11 >> 0x20) * fVar31;
    fVar26 = (*points).x;
    fVar32 = (*points).y;
    *pfVar1 = fVar25 + fVar26;
    pfVar1[1] = fVar30 + fVar32;
    pfVar1[2] = fVar26 - fVar25;
    pfVar1[3] = fVar32 - fVar30;
    uVar16 = (ulong)(uint)((int)local_80 * 2);
    *(ulong *)(pfVar1 + uVar16 * 2) =
         CONCAT44((float)((ulong)puVar11[uVar10] >> 0x20) * fVar31 + fVar27,
                  (float)puVar11[uVar10] * fVar31 + fVar29);
    *(ulong *)(pfVar1 + uVar16 * 2 + 2) =
         CONCAT44(fVar27 - (float)((ulong)puVar11[uVar10] >> 0x20) * fVar31,
                  fVar29 - (float)puVar11[uVar10] * fVar31);
  }
  else {
    if ((float)local_a8._0_4_ < local_98.x && local_31 == 0) {
      fVar31 = (local_78 - (float)local_a8._0_4_) * 0.5;
      fVar34 = (float)local_a8._0_4_ + fVar31;
LAB_00130ef0:
      uVar14 = this->_VtxCurrentIdx;
      pIVar17 = this->_IdxWritePtr;
      *(undefined8 *)(local_a8 + lVar12 + -8) = 1;
      for (uVar10 = *(ulong *)(local_a8 + lVar12 + -8); uVar23 + uVar10 != 1; uVar10 = uVar10 + 1) {
        uVar23 = uVar10 & 0xffffffff;
        if (uVar15 == uVar10) {
          uVar23 = 0;
        }
        uVar22 = uVar14 + 4;
        if (uVar15 == uVar10) {
          uVar22 = this->_VtxCurrentIdx;
        }
        fVar27 = ((float)puVar11[uVar23] +
                 (float)*(undefined8 *)(local_a8 + uVar10 * 8 + lVar12 + -8)) * 0.5;
        fVar25 = ((float)((ulong)puVar11[uVar23] >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_a8 + uVar10 * 8 + lVar12 + -8) >> 0x20)) * 0.5
        ;
        fVar30 = fVar27 * fVar27 + fVar25 * fVar25;
        fVar29 = 0.5;
        if (0.5 <= fVar30) {
          fVar29 = fVar30;
        }
        fVar29 = 1.0 / fVar29;
        fVar32 = points[uVar23].x;
        fVar28 = points[uVar23].y;
        uVar15 = (ulong)(uint)((int)uVar23 << 2);
        fVar30 = fVar27 * fVar29 * fVar34;
        fVar26 = fVar25 * fVar29 * fVar34;
        fVar27 = fVar27 * fVar29 * fVar31;
        fVar29 = fVar25 * fVar29 * fVar31;
        pfVar2 = pfVar1 + uVar15 * 2;
        *pfVar2 = fVar32 + fVar30;
        pfVar2[1] = fVar28 + fVar26;
        pfVar2[2] = fVar32 + fVar27;
        pfVar2[3] = fVar28 + fVar29;
        pfVar2 = pfVar1 + uVar15 * 2 + 4;
        *pfVar2 = fVar32 - fVar27;
        pfVar2[1] = fVar28 - fVar29;
        pfVar2[2] = fVar32 - fVar30;
        pfVar2[3] = fVar28 - fVar26;
        IVar13 = (ImDrawIdx)uVar22;
        IVar20 = IVar13 + 1;
        *pIVar17 = IVar20;
        IVar21 = (ImDrawIdx)uVar14;
        pIVar17[1] = IVar21 + 1;
        IVar24 = IVar21 + 2;
        pIVar17[2] = IVar24;
        pIVar17[3] = IVar24;
        IVar19 = IVar13 + 2;
        pIVar17[4] = IVar19;
        pIVar17[5] = IVar20;
        pIVar17[6] = IVar20;
        pIVar17[7] = IVar21 + 1;
        pIVar17[8] = IVar21;
        pIVar17[9] = IVar21;
        pIVar17[10] = IVar13;
        pIVar17[0xb] = IVar20;
        pIVar17[0xc] = IVar19;
        pIVar17[0xd] = IVar24;
        pIVar17[0xe] = IVar21 + 3;
        pIVar17[0xf] = IVar21 + 3;
        pIVar17[0x10] = IVar13 + 3;
        pIVar17[0x11] = IVar19;
        pIVar17 = pIVar17 + 0x12;
        this->_IdxWritePtr = pIVar17;
        uVar15 = local_40;
        uVar23 = local_48;
        uVar14 = uVar22;
      }
      for (lVar12 = 0; uVar15 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8);
        this->_VtxWritePtr->uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = local_38;
        pIVar5[1].pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8 + 8);
        this->_VtxWritePtr[1].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[1].col = col;
        pIVar5[2].pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8 + 0x10);
        this->_VtxWritePtr[2].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[2].col = col;
        pIVar5[3].pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8 + 0x18);
        this->_VtxWritePtr[3].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[3].col = local_38;
        this->_VtxWritePtr = pIVar5 + 4;
      }
      goto LAB_00131127;
    }
    bVar18 = local_31;
    if (local_31 != 0) {
      fVar31 = local_78 * 0.5 + 1.0;
    }
  }
  uVar14 = this->_VtxCurrentIdx;
  pIVar17 = this->_IdxWritePtr;
  *(undefined8 *)(local_a8 + lVar12 + -8) = 1;
  for (uVar10 = *(ulong *)(local_a8 + lVar12 + -8); uVar23 + uVar10 != 1; uVar10 = uVar10 + 1) {
    uVar23 = uVar10 & 0xffffffff;
    if (uVar15 == uVar10) {
      uVar23 = 0;
    }
    uVar22 = uVar14 + (bVar18 ^ 3);
    if (uVar15 == uVar10) {
      uVar22 = this->_VtxCurrentIdx;
    }
    fVar30 = points[uVar23].x;
    fVar26 = points[uVar23].y;
    fVar27 = ((float)puVar11[uVar23] + (float)*(undefined8 *)(local_a8 + uVar10 * 8 + lVar12 + -8))
             * 0.5;
    fVar25 = ((float)((ulong)puVar11[uVar23] >> 0x20) +
             (float)((ulong)*(undefined8 *)(local_a8 + uVar10 * 8 + lVar12 + -8) >> 0x20)) * 0.5;
    fVar32 = fVar27 * fVar27 + fVar25 * fVar25;
    fVar29 = 0.5;
    if (0.5 <= fVar32) {
      fVar29 = fVar32;
    }
    fVar27 = (1.0 / fVar29) * fVar27 * fVar31;
    fVar29 = (1.0 / fVar29) * fVar25 * fVar31;
    pfVar2 = pfVar1 + (ulong)(uint)((int)uVar23 * 2) * 2;
    *pfVar2 = fVar27 + fVar30;
    pfVar2[1] = fVar29 + fVar26;
    pfVar2[2] = fVar30 - fVar27;
    pfVar2[3] = fVar26 - fVar29;
    uVar23 = local_40;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar17 = IVar21;
    IVar13 = (ImDrawIdx)uVar14;
    pIVar17[1] = IVar13;
    if (local_31 == 0) {
      pIVar17[2] = IVar13 + 2;
      pIVar17[3] = IVar13 + 2;
      pIVar17[4] = IVar21 + 2;
      pIVar17[5] = IVar21;
      pIVar17[6] = IVar21 + 1;
      pIVar17[7] = IVar13 + 1;
      pIVar17[8] = IVar13;
      pIVar17[9] = IVar13;
      pIVar17[10] = IVar21;
      pIVar17[0xb] = IVar21 + 1;
      *(undefined8 *)(local_a8 + lVar12 + -8) = 0x18;
    }
    else {
      pIVar17[2] = IVar13 + 1;
      pIVar17[3] = IVar21 + 1;
      pIVar17[4] = IVar13 + 1;
      pIVar17[5] = IVar21;
      *(undefined8 *)(local_a8 + lVar12 + -8) = 0xc;
      uVar23 = uVar15;
    }
    pIVar17 = (ImDrawIdx *)((long)pIVar17 + *(long *)(local_a8 + lVar12 + -8));
    this->_IdxWritePtr = pIVar17;
    uVar15 = uVar23;
    uVar23 = local_48;
    uVar14 = uVar22;
  }
  if (local_31 == 0) {
    for (lVar12 = 0; uVar15 * 8 - lVar12 != 0; lVar12 = lVar12 + 8) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar12);
      this->_VtxWritePtr->uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos = *(ImVec2 *)((long)puVar11 + lVar12 * 2 + uVar15 * 8);
      this->_VtxWritePtr[1].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = local_38;
      pIVar5[2].pos = *(ImVec2 *)((long)puVar11 + lVar12 * 2 + uVar15 * 8 + 8);
      this->_VtxWritePtr[2].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[2].col = local_38;
      this->_VtxWritePtr = pIVar5 + 3;
    }
  }
  else {
    pIVar6 = this->_Data->TexUvLines;
    pIVar3 = pIVar6 + local_4c;
    fVar31 = pIVar3->x;
    fVar29 = pIVar3->y;
    pIVar6 = pIVar6 + local_4c;
    fVar27 = pIVar6->z;
    fVar25 = pIVar6->w;
    for (lVar12 = 0; uVar15 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8);
      pIVar5 = this->_VtxWritePtr;
      (pIVar5->uv).x = fVar31;
      (pIVar5->uv).y = fVar29;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos = *(ImVec2 *)((long)puVar11 + lVar12 + uVar15 * 8 + 8);
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].uv.x = fVar27;
      pIVar5[1].uv.y = fVar25;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = col;
      this->_VtxWritePtr = pIVar5 + 2;
    }
  }
LAB_00131127:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_54;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}